

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simulator.cc
# Opt level: O2

void __thiscall
AVO::Simulator::setAgentDefaults
          (Simulator *this,float neighborDist,size_t maxNeighbors,float timeHorizon,float radius,
          float maxSpeed,float maxAccel,float accelInterval,Vector2 *velocity)

{
  Agent *this_00;
  
  this_00 = this->defaultAgent_;
  if (this_00 == (Agent *)0x0) {
    this_00 = (Agent *)operator_new(200);
    Agent::Agent(this_00);
    this->defaultAgent_ = this_00;
  }
  this_00->accelInterval_ = accelInterval;
  this_00->maxAccel_ = maxAccel;
  this_00->maxNeighbors_ = maxNeighbors;
  this_00->maxSpeed_ = maxSpeed;
  this_00->neighborDist_ = neighborDist;
  this_00->radius_ = radius;
  this_00->timeHorizon_ = timeHorizon;
  this_00->velocity_ = *velocity;
  return;
}

Assistant:

void Simulator::setAgentDefaults(float neighborDist, std::size_t maxNeighbors,
                                 float timeHorizon, float radius,
                                 float maxSpeed, float maxAccel,
                                 float accelInterval, const Vector2 &velocity) {
  if (defaultAgent_ == NULL) {
    defaultAgent_ = new Agent();
  }

  assert(accelInterval >= 0.0F);
  defaultAgent_->accelInterval_ = accelInterval;
  assert(maxAccel >= 0.0F);
  defaultAgent_->maxAccel_ = maxAccel;
  defaultAgent_->maxNeighbors_ = maxNeighbors;
  assert(maxSpeed >= 0.0F);
  defaultAgent_->maxSpeed_ = maxSpeed;
  assert(neighborDist >= 0.0F);
  defaultAgent_->neighborDist_ = neighborDist;
  assert(radius >= 0.0F);
  defaultAgent_->radius_ = radius;
  assert(timeHorizon >= 0.0F);
  defaultAgent_->timeHorizon_ = timeHorizon;
  defaultAgent_->velocity_ = velocity;
}